

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v7::vprint<char[33],char>
          (v7 *this,FILE *f,text_style *ts,char (*format) [33],
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          args)

{
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  char *chars;
  char local_289;
  char (*local_288) [33];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aStack_280;
  basic_string_view<char> local_270;
  allocator<char> local_249;
  undefined1 local_248 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buf;
  char (*format_local) [33];
  text_style *ts_local;
  FILE *f_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_local;
  
  buf._528_8_ = ts;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  local_270 = to_string_view<char,_0>((char *)buf._528_8_);
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
          )args.desc_;
  args_00.desc_ = (unsigned_long_long)format;
  local_288 = format;
  aStack_280 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )args.desc_;
  detail::vformat_to<char>((buffer<char> *)local_248,(text_style *)f,local_270,args_00);
  local_289 = '\0';
  detail::buffer<char>::push_back((buffer<char> *)local_248,&local_289);
  chars = detail::buffer<char>::data((buffer<char> *)local_248);
  detail::fputs<char>(chars,(FILE *)this);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  return;
}

Assistant:

void vprint(std::FILE* f, const text_style& ts, const S& format,
            basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buf;
  detail::vformat_to(buf, ts, to_string_view(format), args);
  buf.push_back(Char(0));
  detail::fputs(buf.data(), f);
}